

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLASTConstantExpression.cpp
# Opt level: O0

void __thiscall
MathML::AST::ConstantExpression::ConstantExpression(ConstantExpression *this,long val)

{
  undefined8 in_RSI;
  INode *in_RDI;
  
  INode::INode(in_RDI);
  in_RDI->_vptr_INode = (_func_int **)&PTR__ConstantExpression_00e6dbd8;
  std::__cxx11::string::string((string *)(in_RDI + 3));
  (*in_RDI->_vptr_INode[7])(in_RDI,in_RSI);
  return;
}

Assistant:

ConstantExpression::ConstantExpression( long val )
        {
            setValue( val );
        }